

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O1

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm)

{
  float fVar1;
  int iVar2;
  vorbis_info *pvVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  float **ppfVar7;
  float *pfVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  pvVar3 = v->vi;
  plVar4 = (long *)pvVar3->codec_setup;
  uVar5 = v->W;
  lVar6 = plVar4[uVar5];
  bVar9 = (char)plVar4[0x2d2] + 1;
  uVar14 = *plVar4 >> (bVar9 & 0x3f);
  uVar13 = plVar4[1] >> (bVar9 & 0x3f);
  iVar10 = v->pcm_returned;
  if (iVar10 < 0) {
    return 0;
  }
  uVar12 = (uint)uVar13;
  if (v->centerW == (long)(int)uVar12) {
    iVar2 = pvVar3->channels;
    if (0 < (long)iVar2) {
      ppfVar7 = v->pcm;
      uVar13 = uVar13 & 0xffffffff;
      lVar16 = 0;
      do {
        if (0 < (int)uVar12) {
          pfVar8 = ppfVar7[lVar16];
          uVar11 = 0;
          do {
            fVar1 = pfVar8[uVar11];
            pfVar8[uVar11] = pfVar8[uVar13 + uVar11];
            pfVar8[uVar13 + uVar11] = fVar1;
            uVar11 = uVar11 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar11);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar2);
    }
    v->pcm_current = v->pcm_current - uVar12;
    v->pcm_returned = iVar10 - uVar12;
    v->centerW = 0;
  }
  iVar10 = (int)uVar14;
  if ((uVar5 ^ v->lW) == 1) {
    iVar2 = pvVar3->channels;
    if (0 < (long)iVar2) {
      ppfVar7 = v->pcm;
      lVar16 = 0;
      do {
        if (1 < (int)(uVar12 + iVar10)) {
          pfVar8 = ppfVar7[lVar16];
          lVar15 = (ulong)(uint)((int)(uVar12 + iVar10) / 2) + 1;
          do {
            pfVar8[(long)((int)(uVar12 - iVar10) / 2) + lVar15 + -2] = pfVar8[lVar15 + -2];
            lVar15 = lVar15 + -1;
          } while (1 < lVar15);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar2);
    }
    iVar10 = (int)(uVar12 - iVar10) / 2;
  }
  else {
    if (v->lW != 0) goto LAB_001d3541;
    iVar2 = pvVar3->channels;
    if (0 < (long)iVar2) {
      ppfVar7 = v->pcm;
      lVar16 = 0;
      do {
        if (0 < iVar10) {
          pfVar8 = ppfVar7[lVar16];
          lVar15 = (uVar14 & 0xffffffff) + 1;
          do {
            pfVar8[(long)(int)uVar12 + ((lVar15 + -2) - (long)iVar10)] = pfVar8[lVar15 + -2];
            lVar15 = lVar15 + -1;
          } while (1 < lVar15);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar2);
    }
    iVar10 = uVar12 - iVar10;
  }
  v->pcm_returned = v->pcm_returned + iVar10;
  v->pcm_current = v->pcm_current + iVar10;
LAB_001d3541:
  if (pcm != (float ***)0x0) {
    iVar10 = pvVar3->channels;
    if (0 < (long)iVar10) {
      iVar2 = v->pcm_returned;
      lVar16 = 0;
      do {
        v->pcmret[lVar16] = v->pcm[lVar16] + iVar2;
        lVar16 = lVar16 + 1;
      } while (iVar10 != lVar16);
    }
    *pcm = v->pcmret;
  }
  return ((int)(lVar6 >> (bVar9 & 0x3f)) + uVar12) - v->pcm_returned;
}

Assistant:

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm){
  vorbis_info *vi=v->vi;
  codec_setup_info *ci=vi->codec_setup;
  int hs=ci->halfrate_flag;

  int n=ci->blocksizes[v->W]>>(hs+1);
  int n0=ci->blocksizes[0]>>(hs+1);
  int n1=ci->blocksizes[1]>>(hs+1);
  int i,j;

  if(v->pcm_returned<0)return 0;

  /* our returned data ends at pcm_returned; because the synthesis pcm
     buffer is a two-fragment ring, that means our data block may be
     fragmented by buffering, wrapping or a short block not filling
     out a buffer.  To simplify things, we unfragment if it's at all
     possibly needed. Otherwise, we'd need to call lapout more than
     once as well as hold additional dsp state.  Opt for
     simplicity. */

  /* centerW was advanced by blockin; it would be the center of the
     *next* block */
  if(v->centerW==n1){
    /* the data buffer wraps; swap the halves */
    /* slow, sure, small */
    for(j=0;j<vi->channels;j++){
      float *p=v->pcm[j];
      for(i=0;i<n1;i++){
        float temp=p[i];
        p[i]=p[i+n1];
        p[i+n1]=temp;
      }
    }

    v->pcm_current-=n1;
    v->pcm_returned-=n1;
    v->centerW=0;
  }

  /* solidify buffer into contiguous space */
  if((v->lW^v->W)==1){
    /* long/short or short/long */
    for(j=0;j<vi->channels;j++){
      float *s=v->pcm[j];
      float *d=v->pcm[j]+(n1-n0)/2;
      for(i=(n1+n0)/2-1;i>=0;--i)
        d[i]=s[i];
    }
    v->pcm_returned+=(n1-n0)/2;
    v->pcm_current+=(n1-n0)/2;
  }else{
    if(v->lW==0){
      /* short/short */
      for(j=0;j<vi->channels;j++){
        float *s=v->pcm[j];
        float *d=v->pcm[j]+n1-n0;
        for(i=n0-1;i>=0;--i)
          d[i]=s[i];
      }
      v->pcm_returned+=n1-n0;
      v->pcm_current+=n1-n0;
    }
  }

  if(pcm){
    int i;
    for(i=0;i<vi->channels;i++)
      v->pcmret[i]=v->pcm[i]+v->pcm_returned;
    *pcm=v->pcmret;
  }

  return(n1+n-v->pcm_returned);

}